

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_manager.hpp
# Opt level: O0

void __thiscall
libtorrent::alert_manager::emplace_alert<libtorrent::lsd_error_alert,boost::system::error_code&>
          (alert_manager *this,error_code *args)

{
  int iVar1;
  value_type *pvVar2;
  value_type *args_00;
  type a;
  unique_lock<std::recursive_mutex> lock_1;
  bad_alloc *anon_var_0;
  lsd_error_alert *alert;
  undefined1 local_28 [8];
  unique_lock<std::recursive_mutex> lock;
  error_code *args_local;
  alert_manager *this_local;
  
  lock._8_8_ = args;
  std::unique_lock<std::recursive_mutex>::unique_lock
            ((unique_lock<std::recursive_mutex> *)local_28,&this->m_mutex);
  pvVar2 = libtorrent::aux::
           container_wrapper<libtorrent::heterogeneous_queue<libtorrent::alert>,_long,_std::array<libtorrent::heterogeneous_queue<libtorrent::alert>,_2UL>_>
           ::operator[](&this->m_alerts,(long)this->m_generation);
  iVar1 = heterogeneous_queue<libtorrent::alert>::size(pvVar2);
  if (iVar1 / 1 < this->m_queue_size_limit) {
    pvVar2 = libtorrent::aux::
             container_wrapper<libtorrent::heterogeneous_queue<libtorrent::alert>,_long,_std::array<libtorrent::heterogeneous_queue<libtorrent::alert>,_2UL>_>
             ::operator[](&this->m_alerts,(long)this->m_generation);
    args_00 = libtorrent::aux::
              container_wrapper<libtorrent::aux::stack_allocator,_long,_std::array<libtorrent::aux::stack_allocator,_2UL>_>
              ::operator[](&this->m_allocations,(long)this->m_generation);
    a = heterogeneous_queue<libtorrent::alert>::
        emplace_back<libtorrent::lsd_error_alert,libtorrent::aux::stack_allocator&,boost::system::error_code&>
                  (pvVar2,args_00,(error_code *)lock._8_8_);
    maybe_notify(this,&a->super_alert);
  }
  else {
    std::bitset<97UL>::set(&this->m_dropped,0x52,true);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_28);
  return;
}

Assistant:

void emplace_alert(Args&&... args) try
		{
			std::unique_lock<std::recursive_mutex> lock(m_mutex);

			// don't add more than this number of alerts, unless it's a
			// high priority alert, in which case we try harder to deliver it
			// for high priority alerts, double the upper limit
			if (m_alerts[m_generation].size() / (1 + T::priority)
				>= m_queue_size_limit)
			{
				// record that we dropped an alert of this type
				m_dropped.set(T::alert_type);
				return;
			}

			T& alert = m_alerts[m_generation].emplace_back<T>(
				m_allocations[m_generation], std::forward<Args>(args)...);

			maybe_notify(&alert);
		}
		catch (std::bad_alloc const&)
		{
			// record that we dropped an alert of this type
			std::unique_lock<std::recursive_mutex> lock(m_mutex);
			m_dropped.set(T::alert_type);
		}